

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsmn.h
# Opt level: O0

int jsmn_parse_string(jsmn_parser *parser,char *js,size_t len,jsmntok_t *tokens,size_t num_tokens)

{
  char cVar1;
  uint uVar2;
  jsmntok_t *token_00;
  bool bVar3;
  char c;
  int start;
  jsmntok_t *token;
  size_t num_tokens_local;
  jsmntok_t *tokens_local;
  size_t len_local;
  char *js_local;
  jsmn_parser *parser_local;
  
  uVar2 = parser->pos;
  parser->pos = parser->pos + 1;
  while( true ) {
    bVar3 = false;
    if (parser->pos < len) {
      bVar3 = js[parser->pos] != '\0';
    }
    if (!bVar3) {
      parser->pos = uVar2;
      return -3;
    }
    if (js[parser->pos] == '\"') break;
    if ((js[parser->pos] == '\\') && (parser->pos + 1 < len)) {
      parser->pos = parser->pos + 1;
      cVar1 = js[parser->pos];
      if ((((cVar1 != '\"') && (((cVar1 != '/' && (cVar1 != '\\')) && (cVar1 != 'b')))) &&
          (((cVar1 != 'f' && (cVar1 != 'n')) && (cVar1 != 'r')))) && (cVar1 != 't')) {
        parser->pos = uVar2;
        return -2;
      }
    }
    parser->pos = parser->pos + 1;
  }
  if (tokens == (jsmntok_t *)0x0) {
    return 0;
  }
  token_00 = jsmn_alloc_token(parser,tokens,num_tokens);
  if (token_00 == (jsmntok_t *)0x0) {
    parser->pos = uVar2;
    return -1;
  }
  jsmn_fill_token(token_00,JSMN_STRING,uVar2 + 1,parser->pos);
  return 0;
}

Assistant:

static int jsmn_parse_string(jsmn_parser *parser, const char *js,
                             const size_t len, jsmntok_t *tokens,
                             const size_t num_tokens) {
  jsmntok_t *token;

  int start = parser->pos;
  
  /* Skip starting quote */
  parser->pos++;
  
  for (; parser->pos < len && js[parser->pos] != '\0'; parser->pos++) {
    char c = js[parser->pos];

    /* Quote: end of string */
    if (c == '\"') {
      if (tokens == NULL) {
        return 0;
      }
      token = jsmn_alloc_token(parser, tokens, num_tokens);
      if (token == NULL) {
        parser->pos = start;
        return JSMN_ERROR_NOMEM;
      }
      jsmn_fill_token(token, JSMN_STRING, start + 1, parser->pos);
#ifdef JSMN_PARENT_LINKS
      token->parent = parser->toksuper;
#endif
      return 0;
    }

    /* Backslash: Quoted symbol expected */
    if (c == '\\' && parser->pos + 1 < len) {
      /* int i; */
      parser->pos++;
      switch (js[parser->pos]) {
      /* Allowed escaped symbols */
      case '\"':
      case '/':
      case '\\':
      case 'b':
      case 'f':
      case 'r':
      case 'n':
      case 't':
        break;
#if 0 /* FIXME: PocketSphinx not supporting these at the moment */
      /* Allows escaped symbol \uXXXX */
      case 'u':
        parser->pos++;
        for (i = 0; i < 4 && parser->pos < len && js[parser->pos] != '\0';
             i++) {
          /* If it isn't a hex character we have an error */
          if (!((js[parser->pos] >= 48 && js[parser->pos] <= 57) ||   /* 0-9 */
                (js[parser->pos] >= 65 && js[parser->pos] <= 70) ||   /* A-F */
                (js[parser->pos] >= 97 && js[parser->pos] <= 102))) { /* a-f */
            parser->pos = start;
            return JSMN_ERROR_INVAL;
          }
          parser->pos++;
        }
        parser->pos--;
        break;
#endif
      /* Unexpected symbol */
      default:
        parser->pos = start;
        return JSMN_ERROR_INVAL;
      }
    }
  }
  parser->pos = start;
  return JSMN_ERROR_PART;
}